

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool IsBIP30Unspendable(CBlockIndex *block_index)

{
  long lVar1;
  bool bVar2;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  bool local_92;
  bool local_91;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((in_RDI->m_data)._M_elems + 0x18) == 0x1664a) {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,
                                          CONCAT14(in_stack_ffffffffffffff7c,
                                                   CONCAT13(in_stack_ffffffffffffff7b,
                                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
    bVar2 = operator==((base_blob<256U> *)
                       CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,
                                         CONCAT15(in_stack_ffffffffffffff7d,
                                                  CONCAT14(in_stack_ffffffffffffff7c,
                                                           CONCAT13(in_stack_ffffffffffffff7b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff7a,
                                                  CONCAT11(in_stack_ffffffffffffff79,
                                                           in_stack_ffffffffffffff78))))))),in_RDI);
    local_91 = true;
    if (bVar2) goto LAB_007f2584;
  }
  local_92 = false;
  if (*(int *)((in_RDI->m_data)._M_elems + 0x18) == 0x166a4) {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,
                                          CONCAT14(in_stack_ffffffffffffff7c,
                                                   CONCAT13(in_stack_ffffffffffffff7b,
                                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
    local_92 = operator==((base_blob<256U> *)0xb8de83d6f9306f2f,in_RDI);
  }
  local_91 = local_92;
LAB_007f2584:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Unspendable(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91722 && block_index.GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
           (block_index.nHeight==91812 && block_index.GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"});
}